

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* anon_unknown.dwarf_a1d53b::ConvertToAbsoluteContent
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *content,string *baseDir)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  pointer in_name;
  string_view str;
  string_view str_00;
  string absoluteSrc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  in_name = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (in_name == pbVar1) {
      return __return_storage_ptr__;
    }
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    str._M_str = (in_name->_M_dataplus)._M_p;
    str._M_len = in_name->_M_string_length;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    bVar2 = cmHasLiteralPrefix<2ul>(str,(char (*) [2])0x58ef2d);
    if (bVar2) {
LAB_0027b340:
      std::__cxx11::string::_M_assign((string *)&local_d0);
    }
    else {
      str_00._M_str = (in_name->_M_dataplus)._M_p;
      str_00._M_len = in_name->_M_string_length;
      bVar2 = cmHasLiteralPrefix<2ul>(str_00,(char (*) [2])0x5c4b0e);
      if (bVar2) goto LAB_0027b340;
      bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (bVar2) goto LAB_0027b340;
      sVar3 = cmGeneratorExpression::Find(in_name);
      if (sVar3 == 0) goto LAB_0027b340;
      local_80.View_._M_str = (baseDir->_M_dataplus)._M_p;
      local_80.View_._M_len = baseDir->_M_string_length;
      local_b0.View_._M_len = 1;
      local_b0.View_._M_str = local_b0.Digits_;
      local_b0.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_50,&local_80,&local_b0,in_name);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    in_name = in_name + 1;
  } while( true );
}

Assistant:

std::vector<std::string> ConvertToAbsoluteContent(
  const std::vector<std::string>& content, std::string const& baseDir)
{
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    // Use '<foo.h>' and '"foo.h"' includes and absolute paths as-is.
    // Interpret relative paths with respect to the source directory.
    // If the path starts in a generator expression, assume it is absolute.
    if (cmHasLiteralPrefix(src, "<") || cmHasLiteralPrefix(src, "\"") ||
        cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0) {
      absoluteSrc = src;
    } else {
      absoluteSrc = cmStrCat(baseDir, '/', src);
    }
    absoluteContent.emplace_back(std::move(absoluteSrc));
  }
  return absoluteContent;
}